

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxerutil.cc
# Opt level: O3

int32 mkvmuxer::SerializeFloat(IMkvWriter *writer,float f)

{
  int iVar1;
  undefined8 in_RAX;
  int32 bit_count;
  int iVar2;
  uint8 byte;
  undefined8 uStack_28;
  
  if (writer == (IMkvWriter *)0x0) {
    return -1;
  }
  iVar2 = 0x18;
  uStack_28 = in_RAX;
  do {
    uStack_28 = CONCAT17((char)((uint)f >> ((byte)iVar2 & 0x1f)),(undefined7)uStack_28);
    iVar1 = (**writer->_vptr_IMkvWriter)(writer,(long)&uStack_28 + 7,1);
    if (iVar1 < 0) {
      return iVar1;
    }
    iVar2 = iVar2 + -8;
  } while (iVar2 != -8);
  return 0;
}

Assistant:

int32 SerializeFloat(IMkvWriter* writer, float f) {
  if (!writer)
    return -1;

  assert(sizeof(uint32) == sizeof(float));
  // This union is merely used to avoid a reinterpret_cast from float& to
  // uint32& which will result in violation of strict aliasing.
  union U32 {
    uint32 u32;
    float f;
  } value;
  value.f = f;

  for (int32 i = 1; i <= 4; ++i) {
    const int32 byte_count = 4 - i;
    const int32 bit_count = byte_count * 8;

    const uint8 byte = static_cast<uint8>(value.u32 >> bit_count);

    const int32 status = writer->Write(&byte, 1);

    if (status < 0)
      return status;
  }

  return 0;
}